

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

int QtPrivate::compareStrings(QStringView lhs,QStringView rhs,CaseSensitivity cs)

{
  int iVar1;
  ulong blen;
  ulong alen;
  ulong uVar2;
  ulong uVar3;
  
  alen = lhs.m_size;
  blen = rhs.m_size;
  if (cs != CaseSensitive) {
    iVar1 = ucstricmp(alen,lhs.m_data,blen,rhs.m_data);
    return iVar1;
  }
  uVar2 = blen;
  if (alen < blen) {
    uVar2 = alen;
  }
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      iVar1 = (uint)(ushort)lhs.m_data[uVar3] - (uint)(ushort)rhs.m_data[uVar3];
      if (iVar1 != 0) {
        return iVar1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  iVar1 = (uint)((long)blen < (long)alen) * 2 + -1;
  if (alen == blen) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int QtPrivate::compareStrings(QStringView lhs, QStringView rhs, Qt::CaseSensitivity cs) noexcept
{
    if (cs == Qt::CaseSensitive)
        return ucstrcmp(lhs.utf16(), lhs.size(), rhs.utf16(), rhs.size());
    return ucstricmp(lhs.size(), lhs.utf16(), rhs.size(), rhs.utf16());
}